

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall
OperandEquation::operandOrder
          (OperandEquation *this,Constructor *ct,
          vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_> *order)

{
  pointer *pppOVar1;
  iterator __position;
  uint uVar2;
  OperandSymbol *sym;
  OperandSymbol *local_10;
  
  local_10 = (ct->operands).super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
             _M_impl.super__Vector_impl_data._M_start[this->index];
  uVar2 = local_10->flags;
  if ((uVar2 & 8) == 0) {
    __position._M_current =
         (order->super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (order->super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OperandSymbol*,std::allocator<OperandSymbol*>>::
      _M_realloc_insert<OperandSymbol*const&>
                ((vector<OperandSymbol*,std::allocator<OperandSymbol*>> *)order,__position,&local_10
                );
      uVar2 = local_10->flags;
    }
    else {
      *__position._M_current = local_10;
      pppOVar1 = &(order->super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    local_10->flags = uVar2 | 8;
  }
  return;
}

Assistant:

void OperandEquation::operandOrder(Constructor *ct,vector<OperandSymbol *> &order) const

{
  OperandSymbol *sym = ct->getOperand(index);
  if (!sym->isMarked()) {
    order.push_back(sym);
    sym->setMark();
  }
}